

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

long __thiscall flatbuffers::Table::GetField<long>(Table *this,voffset_t field,long defaultval)

{
  voffset_t vVar1;
  long local_38;
  voffset_t field_offset;
  long defaultval_local;
  voffset_t field_local;
  Table *this_local;
  
  vVar1 = GetOptionalFieldOffset(this,field);
  local_38 = defaultval;
  if (vVar1 != 0) {
    local_38 = ReadScalar<long>(this + (int)(uint)vVar1);
  }
  return local_38;
}

Assistant:

T GetField(voffset_t field, T defaultval) const {
    auto field_offset = GetOptionalFieldOffset(field);
    return field_offset ? ReadScalar<T>(data_ + field_offset) : defaultval;
  }